

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

void __thiscall QInputDialog::done(QInputDialog *this,int result)

{
  long lVar1;
  long lVar2;
  QSpinBox *pQVar3;
  int *piVar4;
  int iVar5;
  char *pcVar6;
  QObject *pQVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  QArrayData *local_58;
  void **local_50;
  undefined8 local_48;
  void *local_38;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  QDialog::done(&this->super_QDialog,result);
  if (result == 0) goto LAB_004ff597;
  lVar2 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  pQVar3 = *(QSpinBox **)(lVar2 + 800);
  if (pQVar3 == (QSpinBox *)0x0) {
LAB_004ff4c8:
    local_58 = *(QArrayData **)(lVar2 + 0x338);
    local_50 = *(void ***)(lVar2 + 0x340);
    local_48 = *(undefined8 *)(lVar2 + 0x348);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_38 = (void *)0x0;
    local_30 = (undefined1 *)&local_58;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_38);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
  }
  else {
    if (pQVar3 == *(QSpinBox **)(lVar2 + 0x300)) {
      iVar5 = QSpinBox::value(*(QSpinBox **)(lVar2 + 0x300));
      local_38 = (void *)CONCAT44(local_38._4_4_,iVar5);
      iVar5 = 3;
    }
    else {
      if (pQVar3 != (QSpinBox *)*(QDoubleSpinBox **)(lVar2 + 0x308)) goto LAB_004ff4c8;
      local_38 = (void *)QDoubleSpinBox::value(*(QDoubleSpinBox **)(lVar2 + 0x308));
      iVar5 = 5;
    }
    local_50 = &local_38;
    local_58 = (QArrayData *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,iVar5,&local_58);
  }
LAB_004ff597:
  if (((*(long *)(lVar1 + 0x350) != 0) && (*(int *)(*(long *)(lVar1 + 0x350) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x358) != 0)) {
    pcVar8 = *(char **)(lVar1 + 0x368);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)&QByteArray::_empty;
    }
    pcVar8 = signalForMember(pcVar8);
    if ((*(long *)(lVar1 + 0x350) == 0) || (*(int *)(*(long *)(lVar1 + 0x350) + 4) == 0)) {
      pQVar7 = (QObject *)0x0;
    }
    else {
      pQVar7 = *(QObject **)(lVar1 + 0x358);
    }
    pcVar6 = *(char **)(lVar1 + 0x368);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect((QObject *)this,pcVar8,pQVar7,pcVar6);
    piVar4 = *(int **)(lVar1 + 0x350);
    *(undefined8 *)(lVar1 + 0x350) = 0;
    *(undefined8 *)(lVar1 + 0x358) = 0;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        operator_delete(piVar4);
      }
    }
  }
  QByteArray::clear();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialog::done(int result)
{
    Q_D(QInputDialog);
    QDialog::done(result);
    if (result) {
        InputMode mode = inputMode();
        switch (mode) {
        case DoubleInput:
            emit doubleValueSelected(doubleValue());
            break;
        case IntInput:
            emit intValueSelected(intValue());
            break;
        default:
            Q_ASSERT(mode == TextInput);
            emit textValueSelected(textValue());
        }
    }
    if (d->receiverToDisconnectOnClose) {
        disconnect(this, signalForMember(d->memberToDisconnectOnClose),
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
}